

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionSubgroupMaxSize
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *this;
  DiagnosticStream local_200;
  uint local_24;
  Instruction *pIStack_20;
  uint size_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant((ValidationState_t *)inst_local,local_24);
  if (bVar1) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    this = DiagnosticStream::operator<<(&local_200,(char (*) [50])0x574aaa);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionSubgroupMaxSize(ValidationState_t& _,
                                                    const Instruction* inst) {
  const auto size_id = inst->GetOperandAs<uint32_t>(4);
  if (!IsUint32Constant(_, size_id)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}